

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundColumnRefExpression::Serialize(BoundColumnRefExpression *this,Serializer *serializer)

{
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  Serializer::WriteProperty<duckdb::ColumnBinding>(serializer,0xc9,"binding",&this->binding);
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,0xca,"depth",&this->depth);
  return;
}

Assistant:

void BoundColumnRefExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty<LogicalType>(200, "return_type", return_type);
	serializer.WriteProperty<ColumnBinding>(201, "binding", binding);
	serializer.WritePropertyWithDefault<idx_t>(202, "depth", depth);
}